

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RelationsGraph.h
# Opt level: O2

BucketSet * __thiscall
dg::vr::RelationsGraph<dg::vr::ValueRelations>::getIntersectingNonstrict
          (BucketSet *__return_storage_ptr__,RelationsGraph<dg::vr::ValueRelations> *this,Bucket *lt
          ,Bucket *rt,Type type)

{
  _Rb_tree_header *p_Var1;
  uint uVar2;
  _Base_ptr p_Var3;
  RelationsMap result;
  RelationsMap rtLE;
  RelationsMap ltGE;
  
  rtLE._M_t._M_impl._0_8_ = 0;
  std::bitset<12UL>::set((bitset<12UL> *)&rtLE,(ulong)type,true);
  getRelated(&ltGE,this,lt,(Relations *)&rtLE,false);
  result._M_t._M_impl._0_8_ = 0;
  uVar2 = dg::vr::Relations::inverted(type);
  std::bitset<12UL>::set((bitset<12UL> *)&result,(ulong)uVar2,true);
  getRelated(&rtLE,this,rt,(Relations *)&result,false);
  p_Var1 = &result._M_t._M_impl.super__Rb_tree_header;
  result._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  result._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  result._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  result._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  result._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  std::
  __set_intersection<std::_Rb_tree_iterator<std::pair<std::reference_wrapper<dg::vr::Bucket_const>const,dg::vr::Relations>>,std::_Rb_tree_iterator<std::pair<std::reference_wrapper<dg::vr::Bucket_const>const,dg::vr::Relations>>,std::insert_iterator<std::map<std::reference_wrapper<dg::vr::Bucket_const>,dg::vr::Relations,std::less<std::reference_wrapper<dg::vr::Bucket_const>>,std::allocator<std::pair<std::reference_wrapper<dg::vr::Bucket_const>const,dg::vr::Relations>>>>,__gnu_cxx::__ops::_Iter_comp_iter<dg::vr::RelationsGraph<dg::vr::ValueRelations>::getIntersectingNonstrict(dg::vr::Bucket_const&,dg::vr::Bucket_const&,dg::vr::Relations::Type)::_lambda(std::pair<std::reference_wrapper<dg::vr::Bucket_const>const,dg::vr::Relations>&,std::pair<std::reference_wrapper<dg::vr::Bucket_const>const,dg::vr::Relations>&)_1_>>
            (ltGE._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
             &ltGE._M_t._M_impl.super__Rb_tree_header,
             rtLE._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
             &rtLE._M_t._M_impl.super__Rb_tree_header,&result,p_Var1);
  (__return_storage_ptr__->vec).
  super__Vector_base<std::reference_wrapper<dg::vr::Bucket>,_std::allocator<std::reference_wrapper<dg::vr::Bucket>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->vec).
  super__Vector_base<std::reference_wrapper<dg::vr::Bucket>,_std::allocator<std::reference_wrapper<dg::vr::Bucket>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->vec).
  super__Vector_base<std::reference_wrapper<dg::vr::Bucket>,_std::allocator<std::reference_wrapper<dg::vr::Bucket>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  for (p_Var3 = result._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var3 != p_Var1; p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
    std::
    vector<std::reference_wrapper<dg::vr::Bucket>,std::allocator<std::reference_wrapper<dg::vr::Bucket>>>
    ::emplace_back<dg::vr::Bucket&>
              ((vector<std::reference_wrapper<dg::vr::Bucket>,std::allocator<std::reference_wrapper<dg::vr::Bucket>>>
                *)__return_storage_ptr__,*(Bucket **)(p_Var3 + 1));
  }
  std::
  _Rb_tree<std::reference_wrapper<const_dg::vr::Bucket>,_std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>,_std::_Select1st<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>_>,_std::less<std::reference_wrapper<const_dg::vr::Bucket>_>,_std::allocator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>_>_>
  ::~_Rb_tree(&result._M_t);
  std::
  _Rb_tree<std::reference_wrapper<const_dg::vr::Bucket>,_std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>,_std::_Select1st<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>_>,_std::less<std::reference_wrapper<const_dg::vr::Bucket>_>,_std::allocator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>_>_>
  ::~_Rb_tree(&rtLE._M_t);
  std::
  _Rb_tree<std::reference_wrapper<const_dg::vr::Bucket>,_std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>,_std::_Select1st<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>_>,_std::less<std::reference_wrapper<const_dg::vr::Bucket>_>,_std::allocator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>_>_>
  ::~_Rb_tree(&ltGE._M_t);
  return __return_storage_ptr__;
}

Assistant:

Bucket::BucketSet getIntersectingNonstrict(const Bucket &lt,
                                               const Bucket &rt,
                                               Relations::Type type) {
        assert(type == Relations::SGE || type == Relations::UGE);
        assert(areRelated(lt, type, rt));
        RelationsMap ltGE = getRelated(lt, Relations().set(type));
        RelationsMap rtLE =
                getRelated(rt, Relations().set(Relations::inverted(type)));

        RelationsMap result;
        std::set_intersection(ltGE.begin(), ltGE.end(), rtLE.begin(),
                              rtLE.end(), std::inserter(result, result.begin()),
                              [](RelationsMap::value_type &ltPair,
                                 RelationsMap::value_type &rtPair) {
                                  return ltPair.first < rtPair.first;
                              });

        Bucket::BucketSet other;
        for (auto &pair : result) {
            Bucket &b = const_cast<Bucket &>(pair.first.get());
            assert(!other.contains(b));
            other.sure_emplace(b);
        }

        return other;
    }